

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerImpl::Init
          (Error *__return_storage_ptr__,CommissionerImpl *this,Config *aConfig)

{
  bool bVar1;
  uint uVar2;
  Error *pEVar3;
  ErrorCode local_134;
  Error local_130;
  ErrorCode local_104;
  DtlsConfig local_100;
  Error local_98;
  shared_ptr<ot::commissioner::Logger> local_70;
  ErrorCode local_60 [4];
  Error local_50;
  undefined1 local_21;
  Config *local_20;
  Config *aConfig_local;
  CommissionerImpl *this_local;
  Error *error;
  
  local_21 = 0;
  local_20 = aConfig;
  aConfig_local = (Config *)this;
  this_local = (CommissionerImpl *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  ValidateConfig(&local_50,local_20);
  pEVar3 = Error::operator=(__return_storage_ptr__,&local_50);
  local_60[0] = kNone;
  bVar1 = commissioner::operator!=(pEVar3,local_60);
  Error::~Error(&local_50);
  if (!bVar1) {
    Config::operator=(&this->mConfig,local_20);
    std::shared_ptr<ot::commissioner::Logger>::shared_ptr(&local_70,&local_20->mLogger);
    InitLogger(&local_70);
    std::shared_ptr<ot::commissioner::Logger>::~shared_ptr(&local_70);
    LoggingConfig(this);
    GetDtlsConfig(&local_100,&this->mConfig);
    coap::CoapSecure::Init(&local_98,&this->mBrClient,&local_100);
    pEVar3 = Error::operator=(__return_storage_ptr__,&local_98);
    local_104 = kNone;
    bVar1 = commissioner::operator!=(pEVar3,&local_104);
    Error::~Error(&local_98);
    DtlsConfig::~DtlsConfig(&local_100);
    if ((!bVar1) &&
       (uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])(), (uVar2 & 1) != 0)) {
      TokenManager::Init(&local_130,&this->mTokenManager,&this->mConfig);
      pEVar3 = Error::operator=(__return_storage_ptr__,&local_130);
      local_134 = kNone;
      commissioner::operator!=(pEVar3,&local_134);
      Error::~Error(&local_130);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::Init(const Config &aConfig)
{
    Error error;

    SuccessOrExit(error = ValidateConfig(aConfig));
    mConfig = aConfig;

    InitLogger(aConfig.mLogger);
    LoggingConfig();

    SuccessOrExit(error = mBrClient.Init(GetDtlsConfig(mConfig)));

#if OT_COMM_CONFIG_CCM_ENABLE
    if (IsCcmMode())
    {
        // It is not good to leave the token manager uninitialized in non-CCM mode.
        // TODO(wgtdkp): create TokenManager only in CCM Mode.
        SuccessOrExit(error = mTokenManager.Init(mConfig));
    }
#endif

exit:
    return error;
}